

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_no_value.hpp
# Opt level: O2

void __thiscall
cfgfile::tag_no_value_t<cfgfile::qstring_trait_t>::on_string
          (tag_no_value_t<cfgfile::qstring_trait_t> *this,
          parser_info_t<cfgfile::qstring_trait_t> *info,string_t *str)

{
  exception_t<cfgfile::qstring_trait_t> *this_00;
  allocator<char> local_21d;
  allocator<char> local_21c;
  allocator<char> local_21b;
  allocator<char> local_21a;
  allocator<char> local_219;
  string_t local_218;
  string_t local_200;
  string_t local_1e8;
  string_t local_1d0;
  string_t local_1b8;
  string_t local_1a0;
  qstring_wrapper_t local_188;
  qstring_wrapper_t local_170;
  qstring_wrapper_t local_158;
  qstring_wrapper_t local_140;
  qstring_wrapper_t local_128;
  qstring_wrapper_t local_110;
  qstring_wrapper_t local_f8;
  qstring_wrapper_t local_e0;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  this_00 = (exception_t<cfgfile::qstring_trait_t> *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Tag \"",&local_219);
  qstring_trait_t::from_ascii(&local_1a0,&local_48);
  operator+(&local_188,&local_1a0,&(this->super_tag_t<cfgfile::qstring_trait_t>).m_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"\" doesn\'t allow any values. But we\'ve got this: \"",&local_21a)
  ;
  qstring_trait_t::from_ascii(&local_1b8,&local_68);
  operator+(&local_170,&local_188,&local_1b8);
  operator+(&local_158,&local_170,str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"\". In file \"",&local_21b);
  qstring_trait_t::from_ascii(&local_1d0,&local_88);
  operator+(&local_140,&local_158,&local_1d0);
  operator+(&local_128,&local_140,&info->m_file_name);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"\" on line ",&local_21c);
  qstring_trait_t::from_ascii(&local_1e8,&local_a8);
  operator+(&local_110,&local_128,&local_1e8);
  qstring_trait_t::to_string(&local_200,info->m_line_number);
  operator+(&local_f8,&local_110,&local_200);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,".",&local_21d);
  qstring_trait_t::from_ascii(&local_218,&local_c8);
  operator+(&local_e0,&local_f8,&local_218);
  exception_t<cfgfile::qstring_trait_t>::exception_t(this_00,&local_e0);
  __cxa_throw(this_00,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
              exception_t<cfgfile::qstring_trait_t>::~exception_t);
}

Assistant:

void on_string( const parser_info_t< Trait > & info,
		const typename Trait::string_t & str ) override
	{
		throw exception_t< Trait >( Trait::from_ascii( "Tag \"" ) +
			this->name() + Trait::from_ascii( "\" doesn't allow any values. "
				"But we've got this: \"" ) +
			str + Trait::from_ascii( "\". In file \"" ) + info.file_name() +
			Trait::from_ascii( "\" on line " ) +
			Trait::to_string( info.line_number() ) +
			Trait::from_ascii( "." ) );
	}